

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O1

void __thiscall Worker::heartbeat(Worker *this,error_code *param_1)

{
  non_const_lvalue<boost::_bi::bind_t<void,_boost::_mfi::mf1<void,_Worker,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<Worker_*>,_boost::arg<1>_(*)()>_>_>
  handler2;
  bind_t<void,_boost::_mfi::mf1<void,_Worker,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<Worker_*>,_boost::arg<1>_(*)()>_>
  local_28;
  
  if ((this->m_stopFlag != true) ||
     ((this->m_pendingJobCount).super___atomic_base<unsigned_long>._M_i != 0)) {
    local_28.f_.f_ = 1000;
    boost::asio::
    basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_from_now(&this->m_wrkTimer,(duration_type *)&local_28);
    local_28.f_.f_ = (F)heartbeat;
    local_28.f_._8_8_ = 0;
    local_28.l_.super_storage2<boost::_bi::value<Worker_*>,_boost::arg<1>_(*)()>.
    super_storage1<boost::_bi::value<Worker_*>_>.a1_.t_ =
         (storage2<boost::_bi::value<Worker_*>,_boost::arg<1>_(*)()>)
         (storage2<boost::_bi::value<Worker_*>,_boost::arg<1>_(*)()>)this;
    boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>>
    ::
    async_wait<boost::_bi::bind_t<void,boost::_mfi::mf1<void,Worker,boost::system::error_code_const&>,boost::_bi::list2<boost::_bi::value<Worker*>,boost::arg<1>(*)()>>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ((deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>> *)
               (this->m_wrkTimer).impl_.service_,&(this->m_wrkTimer).impl_.implementation_,&local_28
               ,&(this->m_wrkTimer).impl_.executor_);
  }
  return;
}

Assistant:

void heartbeat(const boost::system::error_code& /*e*/)
	{
        bool stop = m_stopFlag && m_pendingJobCount.load() == 0;
        if(!stop) {
		    m_wrkTimer.expires_from_now(boost::posix_time::milliseconds(1));
		    m_wrkTimer.async_wait(boost::bind(&Worker::heartbeat, this, boost::asio::placeholders::error));
        }
        else
        {
#if DEBUG
            std::stringstream ss;
            ss << "Worker " << m_name << " completed " << std::this_thread::get_id() << ": " << m_jobCount << " : processed : " << m_processedJobs << std::endl;
            std::cout << ss.str();
            std::cout.flush();
#endif
        }
	}